

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_send_dns_query(mg_connection *nc,char *name,int query_type)

{
  mg_dns_resource_record *rr_00;
  int iVar1;
  size_t nlen;
  uint16_t local_4a;
  mg_dns_resource_record *pmStack_48;
  uint16_t len;
  mg_dns_resource_record *rr;
  mbuf pkt;
  mg_dns_message *msg;
  int query_type_local;
  char *name_local;
  mg_connection *nc_local;
  
  pkt.size = (size_t)calloc(1,0xc20);
  pmStack_48 = (mg_dns_resource_record *)(pkt.size + 0x20);
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_send_dns_query");
    cs_log_printf("%s %d",name,(ulong)(uint)query_type);
  }
  mbuf_init((mbuf *)&rr,0x40);
  mg_dns_tid = mg_dns_tid + 1;
  *(short *)(pkt.size + 0x12) = (short)mg_dns_tid;
  *(undefined2 *)(pkt.size + 0x10) = 0x100;
  *(undefined4 *)(pkt.size + 0x14) = 1;
  mg_dns_insert_header((mbuf *)&rr,0,(mg_dns_message *)pkt.size);
  rr_00 = pmStack_48;
  pmStack_48->rtype = query_type;
  pmStack_48->rclass = 1;
  pmStack_48->kind = MG_DNS_QUESTION;
  nlen = strlen(name);
  iVar1 = mg_dns_encode_record((mbuf *)&rr,rr_00,name,nlen,(void *)0x0,0);
  if (iVar1 != -1) {
    if ((nc->flags & 2) == 0) {
      local_4a = htons((uint16_t)(int)pkt.buf);
      mbuf_insert((mbuf *)&rr,0,&local_4a,2);
    }
    mg_send(nc,rr,(int)pkt.buf);
    mbuf_free((mbuf *)&rr);
  }
  free((void *)pkt.size);
  return;
}

Assistant:

void mg_send_dns_query(struct mg_connection *nc, const char *name,
                       int query_type) {
    struct mg_dns_message *msg =
            (struct mg_dns_message *) MG_CALLOC(1, sizeof(*msg));
    struct mbuf pkt;
    struct mg_dns_resource_record *rr = &msg->questions[0];

    DBG(("%s %d", name, query_type));

    mbuf_init(&pkt, 64 /* Start small, it'll grow as needed. */);

    msg->transaction_id = ++mg_dns_tid;
    msg->flags = 0x100;
    msg->num_questions = 1;

    mg_dns_insert_header(&pkt, 0, msg);

    rr->rtype = query_type;
    rr->rclass = 1; /* Class: inet */
    rr->kind = MG_DNS_QUESTION;

    if (mg_dns_encode_record(&pkt, rr, name, strlen(name), NULL, 0) == -1) {
        /* TODO(mkm): return an error code */
        goto cleanup; /* LCOV_EXCL_LINE */
    }

    /* TCP DNS requires messages to be prefixed with len */
    if (!(nc->flags & MG_F_UDP)) {
        uint16_t len = htons(pkt.len);
        mbuf_insert(&pkt, 0, &len, 2);
    }

    mg_send(nc, pkt.buf, pkt.len);
    mbuf_free(&pkt);

    cleanup:
    MG_FREE(msg);
}